

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

char * __thiscall
MemoryLeakDetector::reallocateMemoryAndLeakInformation
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,size_t line,bool allocatNodesSeperately)

{
  byte bVar1;
  MemoryLeakDetector *this_00;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorNode *in_RCX;
  MemoryLeakDetector *in_RDX;
  MemoryLeakDetector *in_RSI;
  size_t in_RDI;
  char *in_R8;
  char *in_R9;
  byte in_stack_00000008;
  MemoryLeakDetectorNode *node;
  char *new_memory;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  TestMemoryAllocator *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  size_t line_00;
  char *local_8;
  
  bVar1 = in_stack_00000008 & 1;
  line_00 = in_RDI;
  this_00 = (MemoryLeakDetector *)
            reallocateMemoryWithAccountingInformation
                      (in_RSI,(TestMemoryAllocator *)in_RDX,(char *)in_RCX,(size_t)in_R8,in_R9,
                       CONCAT17(in_stack_00000008,in_stack_ffffffffffffffc0) & 0x1ffffffffffffff,
                       SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
  if (this_00 == (MemoryLeakDetector *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    pMVar2 = createMemoryLeakAccountingInformation
                       (this_00,in_stack_ffffffffffffffb0,in_RDI,in_stack_ffffffffffffffa0,
                        SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
    storeLeakInformation
              (in_RDX,in_RCX,in_R8,(size_t)in_R9,
               (TestMemoryAllocator *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),(char *)this_00,
               line_00);
    local_8 = *(char **)(pMVar2 + 0x10);
  }
  return local_8;
}

Assistant:

char* MemoryLeakDetector::reallocateMemoryAndLeakInformation(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
    char* new_memory = reallocateMemoryWithAccountingInformation(allocator, memory, size, file, line, allocatNodesSeperately);
    if (new_memory == NULLPTR) return NULLPTR;

    MemoryLeakDetectorNode *node = createMemoryLeakAccountingInformation(allocator, size, new_memory, allocatNodesSeperately);
    storeLeakInformation(node, new_memory, size, allocator, file, line);
    return node->memory_;
}